

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O3

bool __thiscall Datetime::parse(Datetime *this,string *input,size_type *start,string *format)

{
  bool bVar1;
  size_type sVar2;
  Pig pig;
  Pig local_40;
  
  sVar2 = *start;
  Pig::Pig(&local_40,input);
  if (sVar2 != 0) {
    Pig::skipN(&local_40,(int)sVar2);
  }
  sVar2 = Pig::cursor(&local_40);
  bVar1 = parse_epoch(this,&local_40);
  if (bVar1) {
    sVar2 = Pig::cursor(&local_40);
LAB_00108511:
    *start = sVar2;
  }
  else {
    bVar1 = parse_formatted(this,&local_40,format);
    if ((bVar1) && (bVar1 = validate(this), bVar1)) {
      sVar2 = Pig::cursor(&local_40);
    }
    else {
      bVar1 = parse_date_time_ext(this,&local_40);
      if ((((!bVar1) && (bVar1 = parse_date_time(this,&local_40), !bVar1)) &&
          ((isoEnabled != true ||
           ((((bVar1 = parse_date_ext(this,&local_40), !bVar1 &&
              ((((standaloneDateEnabled != true || (bVar1 = parse_date(this,&local_40), !bVar1)) &&
                (bVar1 = parse_time_utc_ext(this,&local_40), !bVar1)) &&
               ((bVar1 = parse_time_utc(this,&local_40), !bVar1 &&
                (bVar1 = parse_time_off_ext(this,&local_40), !bVar1)))))) &&
             (bVar1 = parse_time_ext(this,&local_40,true), !bVar1)) &&
            (((standaloneTimeEnabled != true || (bVar1 = parse_time(this,&local_40,true), !bVar1))
             && (((standaloneTimeEnabled & 1U) == 0 ||
                 (bVar1 = parse_time_off(this,&local_40), !bVar1)))))))))) ||
         (bVar1 = validate(this), !bVar1)) {
        Pig::restoreTo(&local_40,sVar2);
        bVar1 = parse_named(this,&local_40);
        if (!bVar1) {
          bVar1 = false;
          goto LAB_0010858b;
        }
        sVar2 = Pig::cursor(&local_40);
        goto LAB_00108511;
      }
      sVar2 = Pig::cursor(&local_40);
    }
    *start = sVar2;
    resolve(this);
  }
  bVar1 = true;
LAB_0010858b:
  if (local_40._text.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40._text.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return bVar1;
}

Assistant:

bool Datetime::parse (
  const std::string& input,
  std::string::size_type& start,
  const std::string& format)
{
  auto i = start;
  Pig pig (input);
  if (i)
    pig.skipN (static_cast <int> (i));

  auto checkpoint = pig.cursor ();

  // Parse epoch first, as it's the most common scenario.
  if (parse_epoch (pig))
  {
    // ::validate and ::resolve are not needed in this case.
    start = pig.cursor ();
    return true;
  }

  if (parse_formatted (pig, format))
  {
    // Check the values and determine time_t.
    if (validate ())
    {
      start = pig.cursor ();
      resolve ();
      return true;
    }
  }

  // Allow parse_date_time and parse_date_time_ext regardless of
  // Datetime::isoEnabled setting, because these formats are relied upon by
  // the 'import' command, JSON parser and hook system.
  if (parse_date_time_ext   (pig) || // Strictest first.
      parse_date_time       (pig) ||
      (Datetime::isoEnabled &&
       (                                    parse_date_ext      (pig)  ||
        (Datetime::standaloneDateEnabled && parse_date          (pig)) ||
                                            parse_time_utc_ext  (pig)  ||
                                            parse_time_utc      (pig)  ||
                                            parse_time_off_ext  (pig)  ||
                                            parse_time_ext      (pig)  ||
        (Datetime::standaloneTimeEnabled && parse_time          (pig)) || // Time last, as it is the most permissive.
        (Datetime::standaloneTimeEnabled && parse_time_off      (pig))
       )
      )
     )
  {
    // Check the values and determine time_t.
    if (validate ())
    {
      start = pig.cursor ();
      resolve ();
      return true;
    }
  }

  pig.restoreTo (checkpoint);

  if (parse_named (pig))
  {
    // ::validate and ::resolve are not needed in this case.
    start = pig.cursor ();
    return true;
  }

  return false;
}